

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O0

FUNCTION_RETURN __thiscall
license::hw_identifier::IdentificationStrategy::generate_pc_id
          (IdentificationStrategy *this,HwIdentifier *pc_id)

{
  size_type sVar1;
  const_reference pvVar2;
  FUNCTION_RETURN local_34;
  undefined1 local_30 [4];
  FUNCTION_RETURN result;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  available_ids;
  HwIdentifier *pc_id_local;
  IdentificationStrategy *this_local;
  
  available_ids.
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pc_id;
  (*this->_vptr_IdentificationStrategy[4])(local_30);
  sVar1 = std::
          vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
          ::size((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                  *)local_30);
  if (sVar1 != 0) {
    pvVar2 = std::
             vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
             ::operator[]((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                           *)local_30,0);
    HwIdentifier::operator=
              (available_ids.
               super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar2);
  }
  local_34 = (FUNCTION_RETURN)(sVar1 == 0);
  std::
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  ::~vector((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
             *)local_30);
  return local_34;
}

Assistant:

FUNCTION_RETURN IdentificationStrategy::generate_pc_id(HwIdentifier& pc_id) const {
	const vector<HwIdentifier> available_ids = alternative_ids();
	FUNCTION_RETURN result = FUNC_RET_NOT_AVAIL;
	if (available_ids.size() > 0) {
		pc_id = available_ids[0];
		result = FUNC_RET_OK;
	}
	return result;
}